

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b9e812::AV1LosslessFrameSizeTests::HandleDecodeResult
          (AV1LosslessFrameSizeTests *this,aom_codec_err_t res_dec,Decoder *decoder)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *this_00;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  char **in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  Decoder *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  int line;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_28 [2];
  
  testing::internal::EqHelper::Compare<int,_aom_codec_err_t,_nullptr>
            (in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (aom_codec_err_t *)in_stack_ffffffffffffffa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    pcVar2 = libaom_test::Decoder::DecodeError(in_stack_ffffffffffffffb0);
    line = (int)((ulong)pcVar2 >> 0x20);
    this_00 = (AssertHelper *)
              testing::Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::AssertionResult::failure_message((AssertionResult *)0x881567);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,line,
               (char *)in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x8815b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x881603);
  bVar1 = testing::Test::HasFailure();
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool HandleDecodeResult(const aom_codec_err_t res_dec,
                          libaom_test::Decoder *decoder) override {
    EXPECT_EQ(expected_res_, res_dec) << decoder->DecodeError();
    return !::testing::Test::HasFailure();
  }